

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warped_motion.c
# Opt level: O2

int av1_find_projection(int np,int *pts1,int *pts2,BLOCK_SIZE bsize,int mvy,int mvx,
                       WarpedMotionParams *wm_params,int mi_row,int mi_col)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int32_t iVar6;
  int32_t iVar7;
  int32_t iVar8;
  int32_t iVar9;
  ulong uVar10;
  byte bVar11;
  undefined7 in_register_00000009;
  long lVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  int16_t iDet;
  uint uVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  ulong uVar22;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  
  uVar14 = CONCAT71(in_register_00000009,bsize) & 0xffffffff;
  uVar3 = (uint)(block_size_high[uVar14] >> 1);
  uVar18 = (uint)(block_size_wide[uVar14] >> 1);
  uVar22 = 0;
  uVar14 = (ulong)(uint)np;
  if (np < 1) {
    uVar14 = uVar22;
  }
  local_78 = 0;
  local_6c = 0;
  local_70 = 0;
  local_74 = 0;
  local_64 = 0;
  local_60 = 0;
  local_68 = 0;
  for (; uVar14 != uVar22; uVar22 = uVar22 + 1) {
    iVar4 = pts2[uVar22 * 2] - (mvx + uVar18 * 8 + -8);
    iVar19 = pts1[uVar22 * 2] - (uVar18 * 8 + -8);
    uVar16 = iVar19 - iVar4;
    uVar5 = -uVar16;
    if (0 < (int)uVar16) {
      uVar5 = uVar16;
    }
    if (uVar5 < 0x100) {
      iVar20 = pts2[uVar22 * 2 + 1] - (mvy + uVar3 * 8 + -8);
      iVar17 = pts1[uVar22 * 2 + 1] - (uVar3 * 8 + -8);
      uVar16 = iVar17 - iVar20;
      uVar5 = -uVar16;
      if (0 < (int)uVar16) {
        uVar5 = uVar16;
      }
      if (uVar5 < 0x100) {
        local_68 = local_68 + ((iVar19 * 4 + 0x20) * iVar19 + 0x80 >> 4);
        local_60 = local_60 + (iVar19 * 4 * iVar17 + (iVar17 + iVar19) * 0x10 + 0x40 >> 4);
        local_64 = local_64 + ((iVar17 * 4 + 0x20) * iVar17 + 0x80 >> 4);
        local_74 = local_74 + ((iVar19 + iVar4) * 0x10 + 0x80 + iVar19 * iVar4 * 4 >> 4);
        local_70 = local_70 + ((iVar4 + iVar17) * 0x10 + iVar4 * 4 * iVar17 + 0x40 >> 4);
        local_6c = local_6c + (iVar20 * 4 * iVar19 + (iVar19 + iVar20) * 0x10 + 0x40 >> 4);
        local_78 = ((iVar17 + iVar20) * 0x10 + 0x80 + iVar17 * iVar20 * 4 >> 4) + local_78;
      }
    }
  }
  lVar13 = (long)local_68;
  lVar21 = (long)local_64;
  lVar12 = (long)local_60;
  uVar14 = lVar13 * lVar21 - lVar12 * lVar12;
  if (uVar14 == 0) {
    uVar3 = 1;
  }
  else {
    uVar22 = -uVar14;
    if (0 < (long)uVar14) {
      uVar22 = uVar14;
    }
    uVar10 = uVar22 >> 0x20;
    uVar1 = uVar10;
    if (uVar10 == 0) {
      uVar1 = uVar22;
    }
    uVar5 = 0x1f;
    if ((uint)uVar1 != 0) {
      for (; (uint)uVar1 >> uVar5 == 0; uVar5 = uVar5 - 1) {
      }
    }
    uVar5 = uVar5 ^ ((uint)(uVar10 != 0) << 5 | 0x1f) ^ 0x1f;
    bVar11 = (byte)uVar5;
    lVar15 = (-1L << (bVar11 & 0x3f)) + uVar22;
    if (uVar5 < 9) {
      lVar15 = lVar15 << (8 - bVar11 & 0x3f);
    }
    else {
      lVar15 = (long)(((ulong)(1L << (bVar11 - 8 & 0x3f)) >> 1) + lVar15) >> (bVar11 - 8 & 0x3f);
    }
    uVar16 = -(uint)div_lut[lVar15];
    if (-1 < (long)uVar14) {
      uVar16 = (uint)div_lut[lVar15];
    }
    uVar2 = uVar16 << (2 - bVar11 & 0x1f);
    if (1 < uVar5) {
      uVar2 = uVar16;
    }
    uVar16 = uVar5 + 0xfffe & 0xffff;
    if (1 >= uVar5) {
      uVar16 = 0;
    }
    iDet = (int16_t)uVar2;
    iVar6 = get_mult_shift_diag(lVar21 * local_74 - lVar12 * local_70,iDet,uVar16);
    wm_params->wmmat[2] = iVar6;
    iVar7 = get_mult_shift_ndiag(local_70 * lVar13 + (long)local_74 * -lVar12,iDet,uVar16);
    wm_params->wmmat[3] = iVar7;
    iVar8 = get_mult_shift_ndiag(lVar21 * local_6c - lVar12 * local_78,iDet,uVar16);
    wm_params->wmmat[4] = iVar8;
    iVar9 = get_mult_shift_diag(lVar13 * local_78 + -lVar12 * (long)local_6c,iDet,uVar16);
    wm_params->wmmat[5] = iVar9;
    iVar19 = (uVar3 - 1) + mi_row * 4;
    iVar17 = (uVar18 - 1) + mi_col * 4;
    iVar4 = ((0x10000 - iVar6) * iVar17 + mvx * 0x2000) - iVar7 * iVar19;
    iVar19 = (0x10000 - iVar9) * iVar19 + (mvy * 0x2000 - iVar8 * iVar17);
    if (0x7ffffe < iVar4) {
      iVar4 = 0x7fffff;
    }
    if (iVar4 < -0x7fffff) {
      iVar4 = -0x800000;
    }
    wm_params->wmmat[0] = iVar4;
    if (0x7ffffe < iVar19) {
      iVar19 = 0x7fffff;
    }
    if (iVar19 < -0x7fffff) {
      iVar19 = -0x800000;
    }
    wm_params->wmmat[1] = iVar19;
    uVar3 = av1_get_shear_params(wm_params);
    uVar3 = uVar3 ^ 1;
  }
  return uVar3;
}

Assistant:

int av1_find_projection(int np, const int *pts1, const int *pts2,
                        BLOCK_SIZE bsize, int mvy, int mvx,
                        WarpedMotionParams *wm_params, int mi_row, int mi_col) {
  assert(wm_params->wmtype == AFFINE);

  if (find_affine_int(np, pts1, pts2, bsize, mvy, mvx, wm_params, mi_row,
                      mi_col))
    return 1;

  // check compatibility with the fast warp filter
  if (!av1_get_shear_params(wm_params)) return 1;

  return 0;
}